

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall
CVmObjLookupTable::for_each
          (CVmObjLookupTable *this,_func_void_vm_val_t_ptr_vm_val_t_ptr_void_ptr *cb,void *ctx)

{
  uint *puVar1;
  uint uVar2;
  vm_val_t *pvVar3;
  bool bVar4;
  
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar2 = puVar1[1];
  pvVar3 = (vm_val_t *)(puVar1 + (ulong)*puVar1 * 2 + 8);
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    if (pvVar3->typ != VM_EMPTY) {
      (*cb)(pvVar3,pvVar3 + 1,ctx);
    }
    pvVar3 = (vm_val_t *)&pvVar3[2].val;
  }
  return;
}

Assistant:

void CVmObjLookupTable::for_each(
    VMG_ void (*cb)(VMG_ const vm_val_t *key,
                    const vm_val_t *val, void *ctx), void *ctx)
{
    vm_lookup_val *entry;
    uint i;

    /* iterate over each bucket */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* 
         *   if it's in use (i.e., if the key is non-empty), invoke the
         *   callback for the entry 
         */
        if (entry->key.typ != VM_EMPTY)
            (*cb)(vmg_ &entry->key, &entry->val, ctx);
    }
}